

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nap_comm.cpp
# Opt level: O2

void __thiscall
RandomCommTest_TestsInTests_Test::~RandomCommTest_TestsInTests_Test
          (RandomCommTest_TestsInTests_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(RandomCommTest, TestsInTests)
{
    // Get MPI Information
    int rank, num_procs;
    MPI_Comm_rank(MPI_COMM_WORLD, &rank);
    MPI_Comm_size(MPI_COMM_WORLD, &num_procs);

    setenv("PPN", "4", 1);

    // Initial communication info (standard)
    int local_size = 10000; // Number of variables each rank stores
    MPIX_Data send_data;
    MPIX_Data recv_data;
    form_initial_communicator(local_size, &send_data, &recv_data);

    // Determine unique global indices (map from send indices to recv indicies)
    int first = local_size * rank;
    std::vector<int> global_send_idx(send_data.size_msgs);
    std::vector<int> global_recv_idx(recv_data.size_msgs);
    int tag = 29354;
    for (int i = 0; i < send_data.num_msgs; i++)
    {
        int proc = send_data.procs[i];
        int start = send_data.indptr[i];
        int end = send_data.indptr[i+1];
        for (int j = start; j < end; j++)
        {
            int idx = send_data.indices[j];
            global_send_idx[j] = first + idx;
        }
        MPI_Isend(&global_send_idx[start], end - start, MPI_INT, proc,
                tag, MPI_COMM_WORLD, &send_data.requests[i]);
    }
    for (int i = 0; i < recv_data.num_msgs; i++)
    {
        int proc = recv_data.procs[i];
        int start = recv_data.indptr[i];
        int end = recv_data.indptr[i+1];
        MPI_Irecv(&global_recv_idx[start], end - start, MPI_INT, proc,
                tag, MPI_COMM_WORLD, &recv_data.requests[i]);
    }
    if (send_data.num_msgs) MPI_Waitall(send_data.num_msgs, 
            send_data.requests.data(), MPI_STATUSES_IGNORE);
    if (recv_data.num_msgs) MPI_Waitall(recv_data.num_msgs, 
            recv_data.requests.data(), MPI_STATUSES_IGNORE);

    // Initializing node-aware communication package
    NAPComm* nap_comm;
    MPIX_NAPinit(send_data.num_msgs, send_data.procs.data(), 
            send_data.indptr.data(), send_data.indices.data(), 
            recv_data.num_msgs, recv_data.procs.data(), 
            recv_data.indptr.data(), global_send_idx.data(),
            global_recv_idx.data(), MPI_COMM_WORLD, &nap_comm);

    // Test correctness of communication
    std::vector<int> send_vals(local_size);
    int val = local_size*rank;
    for (int i = 0; i < local_size; i++)
    {
        send_vals[i] = val++;
    }
    std::vector<int> std_recv_vals(recv_data.size_msgs);
    std::vector<int> nap_recv_vals(recv_data.size_msgs);

    // 1. Standard Communication
    standard_communication(send_vals, std_recv_vals, 49345, MPI_INT, &send_data, &recv_data);

    // 2. Node-Aware Communication
    NAPData nap_data;
    MPIX_INAPsend(send_vals.data(), nap_comm, MPI_INT, 20423, MPI_COMM_WORLD, &nap_data);
    MPIX_INAPrecv(nap_recv_vals.data(), nap_comm, MPI_INT, 20423, MPI_COMM_WORLD, &nap_data);
    MPIX_NAPwait(nap_comm, &nap_data);

    // 3. Compare std_recv_vals and nap_recv_vals
    for (int i = 0; i < recv_data.size_msgs; i++)
    {
        ASSERT_EQ(std_recv_vals[i], nap_recv_vals[i]);
    }
    
    std::vector<double> send_d_vals(local_size);
    val = local_size*rank;
    for (int i = 0; i < local_size; i++)
    {
        send_vals[i] = val++;
    }
    std::vector<double> std_recv_d_vals(recv_data.size_msgs);
    std::vector<double> nap_recv_d_vals(recv_data.size_msgs);

    // 1. Standard Communication
    standard_communication(send_d_vals, std_recv_d_vals, 49345, MPI_INT, &send_data, &recv_data);

    // 2. Node-Aware Communication
    MPIX_INAPsend(send_d_vals.data(), nap_comm, MPI_INT, 20423, MPI_COMM_WORLD, &nap_data);
    MPIX_INAPrecv(nap_recv_d_vals.data(), nap_comm, MPI_INT, 20423, MPI_COMM_WORLD, &nap_data);
    MPIX_NAPwait(nap_comm, &nap_data);

    // 3. Compare std_recv_vals and nap_recv_vals
    for (int i = 0; i < recv_data.size_msgs; i++)
    {
        ASSERT_NEAR(std_recv_d_vals[i], nap_recv_d_vals[i], 1e-10);
    }

    MPIX_NAPDestroy(&nap_comm);

    setenv("PPN", "16", 1);
}